

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcOrderAction::~IfcOrderAction(IfcOrderAction *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this->super_IfcTask = 0x97f9e8;
  *(undefined8 *)&this->field_0x1c0 = 0x97fad8;
  *(undefined8 *)&(this->super_IfcTask).field_0x88 = 0x97fa10;
  *(undefined8 *)&(this->super_IfcTask).field_0x98 = 0x97fa38;
  *(undefined8 *)&(this->super_IfcTask).field_0xd0 = 0x97fa60;
  (this->super_IfcTask).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTask,_5UL>._vptr_ObjectHelper
       = (_func_int **)0x97fa88;
  *(undefined8 *)&(this->super_IfcTask).field_0x190 = 0x97fab0;
  puVar1 = *(undefined1 **)&(this->super_IfcTask).field_0x1a0;
  if (puVar1 != &this->field_0x1b0) {
    operator_delete(puVar1,*(long *)&this->field_0x1b0 + 1);
  }
  IfcTask::~IfcTask(&this->super_IfcTask,&PTR_construction_vtable_24__0097faf0);
  operator_delete(this,0x1d8);
  return;
}

Assistant:

IfcOrderAction() : Object("IfcOrderAction") {}